

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec32.c
# Opt level: O2

void Hacl_Chacha20_Vec32_chacha20_decrypt_32
               (uint32_t len,uint8_t *out,uint8_t *cipher,uint8_t *key,uint8_t *n,uint32_t ctr)

{
  uint32_t i0;
  ulong uVar1;
  long lVar2;
  uint32_t k [16];
  uint32_t ctx [16];
  uint32_t k_1 [16];
  
  ctx[0xc] = 0;
  ctx[0xd] = 0;
  ctx[0xe] = 0;
  ctx[0xf] = 0;
  ctx[8] = 0;
  ctx[9] = 0;
  ctx[10] = 0;
  ctx[0xb] = 0;
  ctx[4] = 0;
  ctx[5] = 0;
  ctx[6] = 0;
  ctx[7] = 0;
  ctx[0] = 0;
  ctx[1] = 0;
  ctx[2] = 0;
  ctx[3] = 0;
  chacha20_init_32(ctx,key,n,ctr);
  lVar2 = 0x3c;
  for (uVar1 = 0; len >> 6 != uVar1; uVar1 = uVar1 + 1) {
    k[0xc] = 0;
    k[0xd] = 0;
    k[0xe] = 0;
    k[0xf] = 0;
    k[8] = 0;
    k[9] = 0;
    k[10] = 0;
    k[0xb] = 0;
    k[4] = 0;
    k[5] = 0;
    k[6] = 0;
    k[7] = 0;
    k[0] = 0;
    k[1] = 0;
    k[2] = 0;
    k[3] = 0;
    chacha20_core_32(k,ctx,(uint32_t)uVar1);
    *(uint32_t *)(out + lVar2 + -0x3c) = k[0] ^ *(uint *)(cipher + lVar2 + -0x3c);
    *(uint32_t *)(out + lVar2 + -0x38) = k[1] ^ *(uint *)(cipher + lVar2 + -0x38);
    *(uint32_t *)(out + lVar2 + -0x34) = k[2] ^ *(uint *)(cipher + lVar2 + -0x34);
    *(uint32_t *)(out + lVar2 + -0x30) = k[3] ^ *(uint *)(cipher + lVar2 + -0x30);
    *(uint32_t *)(out + lVar2 + -0x2c) = k[4] ^ *(uint *)(cipher + lVar2 + -0x2c);
    *(uint32_t *)(out + lVar2 + -0x28) = k[5] ^ *(uint *)(cipher + lVar2 + -0x28);
    *(uint32_t *)(out + lVar2 + -0x24) = k[6] ^ *(uint *)(cipher + lVar2 + -0x24);
    *(uint32_t *)(out + lVar2 + -0x20) = k[7] ^ *(uint *)(cipher + lVar2 + -0x20);
    *(uint32_t *)(out + lVar2 + -0x1c) = k[8] ^ *(uint *)(cipher + lVar2 + -0x1c);
    *(uint32_t *)(out + lVar2 + -0x18) = k[9] ^ *(uint *)(cipher + lVar2 + -0x18);
    *(uint32_t *)(out + lVar2 + -0x14) = k[10] ^ *(uint *)(cipher + lVar2 + -0x14);
    *(uint32_t *)(out + lVar2 + -0x10) = k[0xb] ^ *(uint *)(cipher + lVar2 + -0x10);
    *(uint32_t *)(out + lVar2 + -0xc) = k[0xc] ^ *(uint *)(cipher + lVar2 + -0xc);
    *(uint32_t *)(out + lVar2 + -8) = k[0xd] ^ *(uint *)(cipher + lVar2 + -8);
    *(uint32_t *)(out + lVar2 + -4) = k[0xe] ^ *(uint *)(cipher + lVar2 + -4);
    *(uint32_t *)(out + lVar2) = k[0xf] ^ *(uint *)(cipher + lVar2);
    lVar2 = lVar2 + 0x40;
  }
  if ((len & 0x3f) != 0) {
    uVar1 = (ulong)(len & 0x3f);
    memset((void *)((long)k + uVar1),0,0x40 - uVar1);
    memcpy(k,cipher + (len & 0xffffffc0),uVar1);
    k_1[0xc] = 0;
    k_1[0xd] = 0;
    k_1[0xe] = 0;
    k_1[0xf] = 0;
    k_1[8] = 0;
    k_1[9] = 0;
    k_1[10] = 0;
    k_1[0xb] = 0;
    k_1[4] = 0;
    k_1[5] = 0;
    k_1[6] = 0;
    k_1[7] = 0;
    k_1[0] = 0;
    k_1[1] = 0;
    k_1[2] = 0;
    k_1[3] = 0;
    chacha20_core_32(k_1,ctx,len >> 6);
    k[1] = k_1[1] ^ k[1];
    k[0] = k_1[0] ^ k[0];
    k[3] = k_1[3] ^ k[3];
    k[2] = k_1[2] ^ k[2];
    k[5] = k_1[5] ^ k[5];
    k[4] = k_1[4] ^ k[4];
    k[7] = k_1[7] ^ k[7];
    k[6] = k_1[6] ^ k[6];
    k[9] = k_1[9] ^ k[9];
    k[8] = k_1[8] ^ k[8];
    k[0xb] = k_1[0xb] ^ k[0xb];
    k[10] = k_1[10] ^ k[10];
    k[0xd] = k_1[0xd] ^ k[0xd];
    k[0xc] = k_1[0xc] ^ k[0xc];
    k[0xf] = k_1[0xf] ^ k[0xf];
    k[0xe] = k_1[0xe] ^ k[0xe];
    memcpy(out + (len & 0xffffffc0),k,uVar1);
  }
  return;
}

Assistant:

void
Hacl_Chacha20_Vec32_chacha20_decrypt_32(
  uint32_t len,
  uint8_t *out,
  uint8_t *cipher,
  uint8_t *key,
  uint8_t *n,
  uint32_t ctr
)
{
  uint32_t ctx[16U] = { 0U };
  chacha20_init_32(ctx, key, n, ctr);
  uint32_t rem = len % 64U;
  uint32_t nb = len / 64U;
  uint32_t rem1 = len % 64U;
  for (uint32_t i0 = 0U; i0 < nb; i0++)
  {
    uint8_t *uu____0 = out + i0 * 64U;
    uint8_t *uu____1 = cipher + i0 * 64U;
    uint32_t k[16U] = { 0U };
    chacha20_core_32(k, ctx, i0);
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      uint32_t u = load32_le(uu____1 + i * 4U);
      uint32_t x = u;
      uint32_t y = x ^ k[i];
      store32_le(uu____0 + i * 4U, y););
  }
  if (rem1 > 0U)
  {
    uint8_t *uu____2 = out + nb * 64U;
    uint8_t plain[64U] = { 0U };
    memcpy(plain, cipher + nb * 64U, rem * sizeof (uint8_t));
    uint32_t k[16U] = { 0U };
    chacha20_core_32(k, ctx, nb);
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      uint32_t u = load32_le(plain + i * 4U);
      uint32_t x = u;
      uint32_t y = x ^ k[i];
      store32_le(plain + i * 4U, y););
    memcpy(uu____2, plain, rem * sizeof (uint8_t));
  }
}